

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseEmitter::reportError(BaseEmitter *this,Error err,char *message)

{
  ErrorHandler *pEVar1;
  
  pEVar1 = this->_errorHandler;
  if (pEVar1 != (ErrorHandler *)0x0) {
    if (message == (char *)0x0) {
      message = DebugUtils::errorAsString(err);
    }
    (*pEVar1->_vptr_ErrorHandler[2])(pEVar1,err,message,this);
  }
  return err;
}

Assistant:

Error BaseEmitter::reportError(Error err, const char* message) {
  ErrorHandler* eh = _errorHandler;
  if (eh) {
    if (!message)
      message = DebugUtils::errorAsString(err);
    eh->handleError(err, message, this);
  }
  return err;
}